

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_mul_mipsel(floatx80 a,floatx80 b,float_status *status)

{
  uint16_t uVar1;
  _Bool _Var2;
  floatx80 fVar3;
  floatx80 fVar4;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 b_00;
  floatx80 b_01;
  uint64_t local_70;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t bSig;
  uint64_t aSig;
  int32_t zExp;
  int32_t bExp;
  int32_t aExp;
  flag zSign;
  flag bSign;
  flag aSign;
  float_status *status_local;
  floatx80 b_local;
  floatx80 a_local;
  uint16_t local_10;
  
  status_local = (float_status *)b.low;
  b_local._8_8_ = a.low;
  b_local.low._0_2_ = b.high;
  uVar1 = a.high;
  fVar3._10_6_ = 0;
  fVar3.low = (long)a._0_10_;
  fVar3.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  _Var2 = floatx80_invalid_encoding(fVar3);
  if ((_Var2) ||
     (a_00.high = (uint16_t)b_local.low, a_00.low = (uint64_t)status_local, a_00._10_6_ = 0,
     _Var2 = floatx80_invalid_encoding(a_00), _Var2)) {
    float_raise_mipsel('\x01',_aExp);
    fVar3 = floatx80_default_nan_mipsel(_aExp);
    local_10 = fVar3.high;
    goto LAB_00a240d3;
  }
  a_01.high = uVar1;
  a_01.low = b_local._8_8_;
  a_01._10_6_ = 0;
  bSig = extractFloatx80Frac(a_01);
  a_02.high = uVar1;
  a_02.low = b_local._8_8_;
  a_02._10_6_ = 0;
  zExp = extractFloatx80Exp(a_02);
  a_03.high = uVar1;
  a_03.low = b_local._8_8_;
  a_03._10_6_ = 0;
  bExp._3_1_ = extractFloatx80Sign(a_03);
  a_04.high = (uint16_t)b_local.low;
  a_04.low = (uint64_t)status_local;
  a_04._10_6_ = 0;
  zSig0 = extractFloatx80Frac(a_04);
  a_05.high = (uint16_t)b_local.low;
  a_05.low = (uint64_t)status_local;
  a_05._10_6_ = 0;
  aSig._4_4_ = extractFloatx80Exp(a_05);
  a_06.high = (uint16_t)b_local.low;
  a_06.low = (uint64_t)status_local;
  a_06._10_6_ = 0;
  bExp._2_1_ = extractFloatx80Sign(a_06);
  bExp._1_1_ = bExp._3_1_ ^ bExp._2_1_;
  if (zExp == 0x7fff) {
    if (((bSig & 0x7fffffffffffffff) != 0) ||
       ((aSig._4_4_ == 0x7fff && ((zSig0 & 0x7fffffffffffffff) != 0)))) {
      a_07.high = uVar1;
      a_07.low = b_local._8_8_;
      b_00.high = (uint16_t)b_local.low;
      b_00.low = (uint64_t)status_local;
      a_07._10_6_ = 0;
      b_00._10_6_ = 0;
      fVar3 = propagateFloatx80NaN_mipsel(a_07,b_00,_aExp);
      local_10 = fVar3.high;
      goto LAB_00a240d3;
    }
    if (aSig._4_4_ != 0 || zSig0 != 0) {
      fVar3 = packFloatx80(bExp._1_1_,0x7fff,0x8000000000000000);
      local_10 = fVar3.high;
      goto LAB_00a240d3;
    }
  }
  else {
    if (aSig._4_4_ != 0x7fff) {
      if (zExp == 0) {
        if (bSig == 0) {
          fVar3 = packFloatx80(bExp._1_1_,0,0);
          local_10 = fVar3.high;
          goto LAB_00a240d3;
        }
        normalizeFloatx80Subnormal_mipsel(bSig,&zExp,&bSig);
      }
      if (aSig._4_4_ == 0) {
        if (zSig0 == 0) {
          fVar3 = packFloatx80(bExp._1_1_,0,0);
          local_10 = fVar3.high;
          goto LAB_00a240d3;
        }
        normalizeFloatx80Subnormal_mipsel(zSig0,(int32_t *)((long)&aSig + 4),&zSig0);
      }
      aSig._0_4_ = zExp + aSig._4_4_ + -0x3ffe;
      mul64To128(bSig,zSig0,&zSig1,&local_70);
      if (0 < (long)zSig1) {
        shortShift128Left(zSig1,local_70,1,&zSig1,&local_70);
        aSig._0_4_ = (int)aSig + -1;
      }
      fVar3 = roundAndPackFloatx80_mipsel
                        (_aExp->floatx80_rounding_precision,bExp._1_1_,(int)aSig,zSig1,local_70,
                         _aExp);
      local_10 = fVar3.high;
      goto LAB_00a240d3;
    }
    if ((zSig0 & 0x7fffffffffffffff) != 0) {
      a_08.high = uVar1;
      a_08.low = b_local._8_8_;
      b_01.high = (uint16_t)b_local.low;
      b_01.low = (uint64_t)status_local;
      a_08._10_6_ = 0;
      b_01._10_6_ = 0;
      fVar3 = propagateFloatx80NaN_mipsel(a_08,b_01,_aExp);
      local_10 = fVar3.high;
      goto LAB_00a240d3;
    }
    if (zExp != 0 || bSig != 0) {
      fVar3 = packFloatx80(bExp._1_1_,0x7fff,0x8000000000000000);
      local_10 = fVar3.high;
      goto LAB_00a240d3;
    }
  }
  float_raise_mipsel('\x01',_aExp);
  fVar3 = floatx80_default_nan_mipsel(_aExp);
  local_10 = fVar3.high;
LAB_00a240d3:
  a_local._8_8_ = fVar3.low;
  fVar4._10_6_ = fVar3._10_6_;
  fVar4.high = local_10;
  fVar4.low = a_local._8_8_;
  return fVar4;
}

Assistant:

floatx80 floatx80_mul(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    (uint64_t) ( aSig<<1 )
             || ( ( bExp == 0x7FFF ) && (uint64_t) ( bSig<<1 ) ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( bExp | bSig ) == 0 ) goto invalid;
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( aExp | aSig ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    zExp = aExp + bExp - 0x3FFE;
    mul64To128( aSig, bSig, &zSig0, &zSig1 );
    if ( 0 < (int64_t) zSig0 ) {
        shortShift128Left( zSig0, zSig1, 1, &zSig0, &zSig1 );
        --zExp;
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}